

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV4MeshFloat(Parser *this,ai_real *fOut)

{
  bool bVar1;
  char *pcVar2;
  ai_real *fOut_local;
  Parser *this_local;
  
  bVar1 = SkipSpaces<char>(&this->filePtr);
  if (bVar1) {
    pcVar2 = fast_atoreal_move<float>(this->filePtr,fOut,true);
    this->filePtr = pcVar2;
  }
  else {
    LogWarning(this,"Unable to parse float: unexpected EOL [#1]");
    *fOut = 0.0;
    this->iLineNumber = this->iLineNumber + 1;
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshFloat(ai_real& fOut)
{
    // skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        // LOG
        LogWarning("Unable to parse float: unexpected EOL [#1]");
        fOut = 0.0;
        ++iLineNumber;
        return;
    }
    // parse the first float
    filePtr = fast_atoreal_move<ai_real>(filePtr,fOut);
}